

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void check_array_opt<zmq::sockopt::array_option<61,1>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2,
               char param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef capturedExpression;
  string val;
  string s;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage13;
  ScopedMessage scopedMessage12;
  long *local_198;
  size_t local_190;
  long local_188 [2];
  SourceLineInfo local_178;
  long local_168 [2];
  MessageBuilder local_158;
  undefined1 local_100 [8];
  undefined8 local_f8;
  undefined1 local_f0 [16];
  undefined8 local_e0;
  string *local_d8;
  undefined1 local_d0 [80];
  ScopedMessage local_80;
  
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"foobar","");
  local_100 = (undefined1  [8])0x19e995;
  local_f8 = 0x61;
  macroName.m_size = 4;
  macroName.m_start = "INFO";
  Catch::MessageBuilder::MessageBuilder(&local_158,macroName,(SourceLineInfo *)local_100,Info);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 "setting ",param_2);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_158.super_MessageStream.m_stream.m_oss,(char *)local_d0._0_8_,local_d0._8_8_);
  Catch::ScopedMessage::ScopedMessage(&local_80,&local_158);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  paVar1 = &local_158.m_info.message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.m_info.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_158.m_info.message._M_dataplus._M_p,
                    local_158.m_info.message.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_158);
  zmq::detail::socket_base::set_option(param_1,0x3d,local_198,local_190);
  if (param_3 == '\0') {
    local_178.file =
         "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp";
    local_178.line = 0x66;
    macroName_00.m_size = 4;
    macroName_00.m_start = "INFO";
    Catch::MessageBuilder::MessageBuilder(&local_158,macroName_00,&local_178,Info);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   "getting ",param_2);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_158.super_MessageStream.m_stream.m_oss,(char *)local_100,local_f8);
    Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_d0,&local_158);
    if (local_100 != (undefined1  [8])local_f0) {
      operator_delete((void *)local_100,(ulong)(local_f0._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.m_info.message._M_dataplus._M_p != paVar1) {
      operator_delete(local_158.m_info.message._M_dataplus._M_p,
                      local_158.m_info.message.field_2._M_allocated_capacity + 1);
    }
    Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_158);
    zmq::detail::socket_base::get<61,1>(&local_178,param_1,0x400);
    local_100 = (undefined1  [8])0x19e995;
    local_f8 = 0x68;
    macroName_01.m_size = 5;
    macroName_01.m_start = "CHECK";
    capturedExpression.m_size = 8;
    capturedExpression.m_start = "s == val";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_158,macroName_01,(SourceLineInfo *)local_100,
               capturedExpression,ContinueOnFailure);
    if (local_178.line == local_190) {
      if (local_178.line == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp(local_178.file,local_198,local_178.line);
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    local_f8._0_2_ = CONCAT11(bVar3,true);
    local_100 = (undefined1  [8])&PTR_streamReconstructedExpression_001dd970;
    local_f0._8_8_ = "==";
    local_e0 = 2;
    local_f0._0_8_ = &local_178;
    local_d8 = (string *)&local_198;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_158,(ITransientExpression *)local_100);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_158);
    if (local_158.m_info.message.field_2._M_local_buf[0xb] == '\0') {
      (**(code **)(*(long *)local_158.m_info.lineInfo.file + 0xa0))();
    }
    if ((long *)local_178.file != local_168) {
      operator_delete(local_178.file,local_168[0] + 1);
    }
    Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_d0);
  }
  Catch::ScopedMessage::~ScopedMessage(&local_80);
  if (local_198 != local_188) {
    operator_delete(local_198,local_188[0] + 1);
  }
  return;
}

Assistant:

void check_array_opt(T opt,
                     zmq::socket_t &sock,
                     std::string info,
                     bool set_only = false)
{
    const std::string val = "foobar";
    INFO("setting " + info);
    sock.set(opt, val);
    if (set_only)
        return;

    INFO("getting " + info);
    auto s = sock.get(opt);
    CHECK(s == val);
}